

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.hpp
# Opt level: O2

bool __thiscall cs::type_id::compare(type_id *this,type_id *id)

{
  bool bVar1;
  
  if (id == this) {
    return true;
  }
  if (this->type_hash != 0) {
    return this->type_hash == id->type_hash;
  }
  bVar1 = std::type_index::operator==(&this->type_idx,&id->type_idx);
  return bVar1;
}

Assistant:

inline bool compare(const type_id &id) const
		{
			if (&id == this)
				return true;
			if (type_hash)
				return type_hash == id.type_hash;
			else
				return type_idx == id.type_idx;
		}